

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  Allocator *pAVar8;
  void *pvVar9;
  float *pfVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  long lVar19;
  void *pvVar20;
  size_t sVar21;
  Deconvolution *pDVar22;
  pointer piVar23;
  int iVar24;
  uint uVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  size_t __size;
  pointer piVar31;
  int iVar32;
  long lVar33;
  pointer piVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  int size_1;
  int iVar38;
  uint uVar39;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  Mat local_178;
  allocator_type local_129;
  Deconvolution *local_128;
  ulong local_120;
  ulong local_118;
  vector<int,_std::allocator<int>_> _space_ofs;
  int size_3;
  int remain;
  ulong uVar40;
  
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  uVar40 = bottom_blob->elemsize;
  iVar38 = (this->kernel_w + -1) * this->dilation_w + (uVar2 - 1) * this->stride_w + 1;
  iVar37 = (this->kernel_h + -1) * this->dilation_h + (uVar3 - 1) * this->stride_h + 1;
  local_178.elemsize = 0;
  local_178.packing = 0;
  local_178.data = (pointer)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.c = 0;
  local_178.cstep = 0;
  local_128 = this;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    if (&local_178 != top_blob) {
      piVar7 = top_blob->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      local_178.data = top_blob->data;
      local_178.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_178.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_178.elemsize = top_blob->elemsize;
      local_178.packing = top_blob->packing;
      local_178.allocator = top_blob->allocator;
      uVar15 = top_blob->dims;
      uVar16 = top_blob->w;
      uVar17 = top_blob->h;
      uVar18 = top_blob->c;
      local_178.cstep = top_blob->cstep;
      local_178.dims = uVar15;
      local_178.w = uVar16;
      local_178.h = uVar17;
      local_178.c = uVar18;
    }
    iVar24 = this->num_output;
    pAVar8 = opt->blob_allocator;
    auVar46._0_4_ = -(uint)(local_178.dims == 3);
    auVar46._4_4_ = -(uint)(iVar38 == local_178.w);
    auVar46._8_4_ = -(uint)(iVar37 == local_178.h);
    auVar46._12_4_ = -(uint)(iVar24 == local_178.c);
    iVar28 = movmskps((int)top_blob,auVar46);
    if ((((iVar28 != 0xf) || (local_178.packing != 1)) || (local_178.allocator != pAVar8)) ||
       (local_178.elemsize != uVar40)) {
      piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if ((pointer)local_178.data != (pointer)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_178.data = (pointer)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.refcount = (int *)0x0;
      local_178.packing = 1;
      local_178.dims = 3;
      local_178.cstep = ((long)(iVar37 * iVar38) * uVar40 + 0xf & 0xfffffffffffffff0) / uVar40;
      local_178.elemsize = uVar40;
      local_178.allocator = pAVar8;
      local_178.w = iVar38;
      local_178.h = iVar37;
      local_178.c = iVar24;
      if ((long)iVar24 * local_178.cstep != 0) {
        uVar42 = (long)iVar24 * local_178.cstep * uVar40 + 3 & 0xfffffffffffffffc;
        __size = uVar42 + 4;
        if (pAVar8 == (Allocator *)0x0) goto LAB_00132bd3;
        iVar24 = (*pAVar8->_vptr_Allocator[2])(pAVar8,__size);
        local_178.data = (pointer)CONCAT44(extraout_var_00,iVar24);
        goto LAB_00132c06;
      }
    }
  }
  else {
    local_178.c = this->num_output;
    local_178.allocator = opt->workspace_allocator;
    auVar50._4_4_ = -(uint)(iVar37 == 0);
    auVar50._0_4_ = -(uint)(iVar38 == 0);
    auVar50._8_4_ = -(uint)(local_178.c == 0);
    auVar50._12_4_ = 0;
    movmskps((int)top_blob,auVar50 << 0x20);
    local_178.data = (pointer)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.refcount = (int *)0x0;
    local_178.packing = 1;
    local_178.dims = 3;
    local_178.cstep = ((long)(iVar37 * iVar38) * uVar40 + 0xf & 0xfffffffffffffff0) / uVar40;
    local_178.elemsize = uVar40;
    local_178.w = iVar38;
    local_178.h = iVar37;
    if ((long)local_178.c * local_178.cstep != 0) {
      uVar42 = (long)local_178.c * local_178.cstep * uVar40 + 3 & 0xfffffffffffffffc;
      __size = uVar42 + 4;
      if (local_178.allocator == (Allocator *)0x0) {
LAB_00132bd3:
        local_178.dims = 3;
        local_178.packing = 1;
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_178.data = (void *)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_178.elemsize = uVar40;
        local_178.w = iVar38;
        local_178.h = iVar37;
        iVar24 = posix_memalign((void **)&_space_ofs,0x10,__size);
        local_178.data =
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar24 != 0) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_178.data =
               _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
      else {
        iVar24 = (*(local_178.allocator)->_vptr_Allocator[2])(local_178.allocator,__size);
        local_178.data = (pointer)CONCAT44(extraout_var,iVar24);
      }
LAB_00132c06:
      local_178.refcount = (int *)((long)local_178.data + uVar42);
      *(undefined4 *)((long)local_178.data + uVar42) = 1;
    }
  }
  pDVar22 = local_128;
  iVar24 = -100;
  if (((pointer)local_178.data == (pointer)0x0) || ((long)local_178.c * local_178.cstep == 0))
  goto LAB_00133323;
  uVar25 = local_128->kernel_w * local_128->kernel_h;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar25,&local_129);
  piVar23 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  iVar24 = local_178.w;
  sVar21 = local_178.elemsize;
  pvVar20 = local_178.data;
  if (0 < pDVar22->kernel_h) {
    iVar28 = pDVar22->dilation_h;
    iVar5 = pDVar22->dilation_w;
    iVar6 = pDVar22->kernel_w;
    iVar27 = 0;
    iVar29 = 0;
    iVar32 = 0;
    do {
      if (0 < pDVar22->kernel_w) {
        lVar35 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar27 + lVar35] = iVar29;
          iVar29 = iVar29 + pDVar22->dilation_w;
          lVar35 = lVar35 + 1;
        } while ((int)lVar35 < pDVar22->kernel_w);
        iVar27 = iVar27 + (int)lVar35;
      }
      iVar29 = iVar29 + (iVar28 * iVar38 - iVar5 * iVar6);
      iVar32 = iVar32 + 1;
    } while (iVar32 < pDVar22->kernel_h);
  }
  iVar28 = pDVar22->num_output;
  if (0 < (long)iVar28) {
    lVar33 = local_178.cstep * local_178.elemsize;
    uVar30 = local_178.h * local_178.w;
    iVar5 = local_128->bias_term;
    iVar6 = local_128->activation_type;
    pvVar9 = (local_128->bias_data).data;
    uVar39 = iVar37 * iVar38;
    uVar40 = (ulong)uVar39;
    pfVar10 = (float *)(local_128->activation_params).data;
    lVar35 = (ulong)uVar30 - 1;
    auVar48._8_4_ = (int)lVar35;
    auVar48._0_8_ = lVar35;
    auVar48._12_4_ = (int)((ulong)lVar35 >> 0x20);
    piVar31 = (pointer)((long)local_178.data + 0xc);
    local_120 = 0;
    auVar48 = auVar48 ^ _DAT_00163170;
    lVar35 = 0;
    piVar34 = (pointer)local_178.data;
    auVar46 = _DAT_00163350;
    auVar49 = _DAT_00163360;
    auVar50 = _DAT_00163170;
    do {
      iVar37 = 0;
      if (iVar5 != 0) {
        iVar37 = *(int *)((long)pvVar9 + lVar35 * 4);
      }
      if (0 < (int)uVar30) {
        uVar42 = 0;
        do {
          auVar45._8_4_ = (int)uVar42;
          auVar45._0_8_ = uVar42;
          auVar45._12_4_ = (int)(uVar42 >> 0x20);
          auVar47 = (auVar45 | auVar49) ^ auVar50;
          iVar38 = auVar48._4_4_;
          if ((bool)(~(iVar38 < auVar47._4_4_ ||
                      auVar48._0_4_ < auVar47._0_4_ && auVar47._4_4_ == iVar38) & 1)) {
            piVar31[uVar42 - 3] = iVar37;
          }
          if (auVar47._12_4_ <= auVar48._12_4_ &&
              (auVar47._8_4_ <= auVar48._8_4_ || auVar47._12_4_ != auVar48._12_4_)) {
            piVar31[uVar42 - 2] = iVar37;
          }
          auVar45 = (auVar45 | auVar46) ^ auVar50;
          iVar27 = auVar45._4_4_;
          if (iVar27 <= iVar38 && (iVar27 != iVar38 || auVar45._0_4_ <= auVar48._0_4_)) {
            piVar31[uVar42 - 1] = iVar37;
            piVar31[uVar42] = iVar37;
          }
          uVar42 = uVar42 + 4;
        } while ((uVar30 + 3 & 0xfffffffc) != uVar42);
      }
      if (0 < (int)uVar3) {
        iVar37 = local_128->stride_h;
        iVar38 = local_128->stride_w;
        pvVar11 = (local_128->weight_data).data;
        local_118 = 0;
        do {
          if (0 < (int)uVar2) {
            iVar27 = bottom_blob->w;
            sVar12 = bottom_blob->elemsize;
            sVar13 = bottom_blob->cstep;
            pvVar14 = bottom_blob->data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar4) {
                lVar19 = uVar42 * (long)iVar38 * 4 +
                         (long)(iVar37 * iVar24 * (int)local_118) * sVar21 + lVar33 * lVar35;
                uVar36 = 0;
                pvVar26 = (void *)((long)(int)local_120 * 4 + (long)pvVar11);
                do {
                  if (0 < (int)uVar25) {
                    fVar44 = *(float *)((long)pvVar14 +
                                       sVar13 * sVar12 * uVar36 +
                                       uVar42 * 4 + (long)iVar27 * local_118 * sVar12);
                    uVar41 = 0;
                    do {
                      *(float *)((long)pvVar20 + (long)piVar23[uVar41] * 4 + lVar19) =
                           *(float *)((long)pvVar26 + uVar41 * 4) * fVar44 +
                           *(float *)((long)pvVar20 + (long)piVar23[uVar41] * 4 + lVar19);
                      uVar41 = uVar41 + 1;
                    } while (uVar25 != uVar41);
                  }
                  uVar36 = uVar36 + 1;
                  pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar25 * 4);
                } while (uVar36 != uVar4);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar2);
          }
          local_118 = local_118 + 1;
        } while (local_118 != uVar3);
      }
      switch(iVar6) {
      case 1:
        if (0 < (int)uVar39) {
          uVar42 = 0;
          do {
            fVar44 = (float)piVar34[uVar42];
            if (fVar44 <= 0.0) {
              fVar44 = 0.0;
            }
            piVar34[uVar42] = (int)fVar44;
            uVar42 = uVar42 + 1;
          } while (uVar40 != uVar42);
        }
        break;
      case 2:
        if (0 < (int)uVar39) {
          fVar44 = *pfVar10;
          uVar42 = 0;
          do {
            uVar43 = -(uint)(0.0 < (float)piVar34[uVar42]);
            piVar34[uVar42] =
                 (int)((float)(~uVar43 & (uint)fVar44 | uVar43 & 0x3f800000) *
                      (float)piVar34[uVar42]);
            uVar42 = uVar42 + 1;
          } while (uVar40 != uVar42);
        }
        break;
      case 3:
        if (0 < (int)uVar39) {
          fVar44 = *pfVar10;
          fVar1 = pfVar10[1];
          uVar42 = 0;
          do {
            if ((float)piVar34[uVar42] <= fVar44 && fVar44 != (float)piVar34[uVar42]) {
              piVar34[uVar42] = (int)fVar44;
            }
            if (fVar1 < (float)piVar34[uVar42]) {
              piVar34[uVar42] = (int)fVar1;
            }
            uVar42 = uVar42 + 1;
          } while (uVar40 != uVar42);
        }
        break;
      case 4:
        if (0 < (int)uVar39) {
          uVar42 = 0;
          do {
            fVar44 = expf((float)(piVar34[uVar42] ^ auVar50._0_4_));
            auVar49 = _DAT_00163360;
            auVar46 = _DAT_00163350;
            auVar50 = _DAT_00163170;
            piVar34[uVar42] = (int)(1.0 / (fVar44 + 1.0));
            uVar42 = uVar42 + 1;
          } while (uVar40 != uVar42);
        }
      }
      lVar35 = lVar35 + 1;
      piVar31 = (pointer)((long)piVar31 + lVar33);
      local_120 = (ulong)((int)local_120 + uVar4 * uVar25);
      piVar34 = (pointer)((long)piVar34 + lVar33);
    } while (lVar35 != iVar28);
  }
  iVar37 = local_128->pad_w;
  iVar38 = local_128->pad_h;
  if (iVar38 < 1 && iVar37 < 1) {
    if (&local_178 != top_blob) {
      if (local_178.refcount != (int *)0x0) {
        LOCK();
        *local_178.refcount = *local_178.refcount + 1;
        UNLOCK();
      }
      piVar7 = top_blob->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = local_178.data;
      top_blob->refcount = local_178.refcount;
      top_blob->elemsize = local_178.elemsize;
      top_blob->packing = local_178.packing;
      top_blob->allocator = local_178.allocator;
      top_blob->dims = local_178.dims;
      top_blob->w = local_178.w;
      top_blob->h = local_178.h;
      top_blob->c = local_178.c;
      top_blob->cstep = local_178.cstep;
    }
LAB_00133306:
    iVar24 = 0;
  }
  else {
    copy_cut_border(&local_178,top_blob,iVar38,iVar38,iVar37,iVar37,opt->blob_allocator,
                    opt->num_threads);
    iVar24 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_00133306;
  }
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00133323:
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (*local_178.refcount == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if ((pointer)local_178.data != (pointer)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = 1.f / (1.f + exp(-outptr[i]));
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}